

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::MemPass::DCEInst
          (MemPass *this,Instruction *inst,function<void_(spvtools::opt::Instruction_*)> *call_back)

{
  pointer pIVar1;
  uint32_t uVar2;
  Instruction *ip;
  pointer pOVar3;
  uint **ppuVar4;
  IRContext *this_00;
  bool bVar5;
  char cVar6;
  pointer pIVar7;
  uint **ppuVar8;
  pointer pOVar9;
  Instruction *odi;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  deadInsts;
  uint32_t varId;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> ids;
  Instruction *local_118;
  undefined8 uStack_110;
  code *local_108;
  code *pcStack_100;
  Instruction *local_f0;
  _Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_e8;
  _func_int **local_98;
  Instruction *pIStack_90;
  Instruction *local_88;
  code *pcStack_80;
  _Any_data *local_70;
  uint *local_68;
  undefined1 local_60 [16];
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f0 = inst;
  local_70 = (_Any_data *)call_back;
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_initialize_map(&local_e8,0);
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    _M_push_back_aux<spvtools::opt::Instruction*const&>
              ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               &local_e8,&local_f0);
  }
  else {
    *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_f0;
    local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pIVar1 = (pointer)(local_60 + 8);
    do {
      ip = *local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (ip->opcode_ == OpLabel) {
        if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
      }
      else {
        local_60._8_4_ = _S_red;
        local_50 = (pointer)0x0;
        local_38 = (pointer)0x0;
        pIStack_90 = (Instruction *)0x0;
        pcStack_80 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:207:21)>
                     ::_M_invoke;
        local_88 = (Instruction *)
                   std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:207:21)>
                   ::_M_manager;
        uStack_110 = 0;
        local_118 = (Instruction *)&local_98;
        pcStack_100 = std::
                      _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                      ::_M_invoke;
        local_108 = std::
                    _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                    ::_M_manager;
        pOVar3 = (ip->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_98 = (_func_int **)local_60;
        local_48 = pIVar1;
        local_40 = pIVar1;
        for (pOVar9 = (ip->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_start; pOVar9 != pOVar3;
            pOVar9 = pOVar9 + 1) {
          bVar5 = spvIsInIdType(pOVar9->type);
          if (bVar5) {
            ppuVar4 = (uint **)(pOVar9->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar8 = &(pOVar9->words).small_data_;
            if (ppuVar4 != (uint **)0x0) {
              ppuVar8 = ppuVar4;
            }
            local_68 = *ppuVar8;
            if (local_108 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar6 = (*pcStack_100)(&local_118,&local_68);
            if (cVar6 == '\0') break;
          }
        }
        if (local_108 != (code *)0x0) {
          (*local_108)(&local_118,&local_118,3);
        }
        if (local_88 != (Instruction *)0x0) {
          (*(code *)local_88)(&local_98,&local_98,3);
        }
        local_98 = (_func_int **)((ulong)local_98 & 0xffffffff00000000);
        if (ip->opcode_ == OpLoad) {
          GetPtr(this,ip,(uint32_t *)&local_98);
        }
        if (*(long *)(local_70 + 1) != 0) {
          local_118 = ip;
          (**(code **)(local_70->_M_pod_data + 0x18))(local_70,&local_118);
        }
        IRContext::KillInst((this->super_Pass).context_,ip);
        for (pIVar7 = local_48; pIVar7 != pIVar1;
            pIVar7 = (pointer)std::_Rb_tree_increment((_Rb_tree_node_base *)pIVar7)) {
          uVar2 = *(uint32_t *)&pIVar7->context_;
          bVar5 = HasOnlyNamesAndDecorates(this,uVar2);
          if (bVar5) {
            this_00 = (this->super_Pass).context_;
            if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(this_00);
            }
            local_118 = analysis::DefUseManager::GetDef
                                  ((this_00->def_use_mgr_)._M_t.
                                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                                   .
                                   super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                                   ._M_head_impl,uVar2);
            bVar5 = IRContext::IsCombinatorInstruction((this->super_Pass).context_,local_118);
            if (bVar5) {
              if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                ::_M_push_back_aux<spvtools::opt::Instruction*const&>
                          ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                            *)&local_e8,&local_118);
              }
              else {
                *local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_118;
                local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
          }
        }
        uVar2 = (uint32_t)local_98;
        if (((uint32_t)local_98 != 0) && (bVar5 = IsLiveVar(this,(uint32_t)local_98), !bVar5)) {
          AddStores(this,uVar2,
                    (queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                     *)&local_e8);
        }
        if (local_e8._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_e8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_e8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_e8._M_impl.super__Deque_impl_data._M_start._M_last =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_first =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_e8._M_impl.super__Deque_impl_data._M_start._M_node =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_e8._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_e8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_60,(_Link_type)local_50);
      }
    } while (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_e8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base(&local_e8);
  return;
}

Assistant:

void MemPass::DCEInst(Instruction* inst,
                      const std::function<void(Instruction*)>& call_back) {
  std::queue<Instruction*> deadInsts;
  deadInsts.push(inst);
  while (!deadInsts.empty()) {
    Instruction* di = deadInsts.front();
    // Don't delete labels
    if (di->opcode() == spv::Op::OpLabel) {
      deadInsts.pop();
      continue;
    }
    // Remember operands
    std::set<uint32_t> ids;
    di->ForEachInId([&ids](uint32_t* iid) { ids.insert(*iid); });
    uint32_t varId = 0;
    // Remember variable if dead load
    if (di->opcode() == spv::Op::OpLoad) (void)GetPtr(di, &varId);
    if (call_back) {
      call_back(di);
    }
    context()->KillInst(di);
    // For all operands with no remaining uses, add their instruction
    // to the dead instruction queue.
    for (auto id : ids)
      if (HasOnlyNamesAndDecorates(id)) {
        Instruction* odi = get_def_use_mgr()->GetDef(id);
        if (context()->IsCombinatorInstruction(odi)) deadInsts.push(odi);
      }
    // if a load was deleted and it was the variable's
    // last load, add all its stores to dead queue
    if (varId != 0 && !IsLiveVar(varId)) AddStores(varId, &deadInsts);
    deadInsts.pop();
  }
}